

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_part.cpp
# Opt level: O3

date_t duckdb::LastDayOperator::Operation<duckdb::timestamp_t,duckdb::date_t>(timestamp_t input)

{
  date_t dVar1;
  int32_t dd;
  int32_t yyyy;
  int32_t local_1c;
  int local_18;
  int local_14;
  
  dVar1 = Timestamp::GetDate(input);
  Date::Convert(dVar1,&local_14,&local_18,&local_1c);
  local_14 = local_14 + local_18 / 0xc;
  local_18 = local_18 % 0xc + 1;
  dVar1 = Date::FromDate(local_14,local_18,1);
  return (date_t)(dVar1.days + -1);
}

Assistant:

date_t LastDayOperator::Operation(timestamp_t input) {
	return LastDayOperator::Operation<date_t, date_t>(Timestamp::GetDate(input));
}